

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterJoinAll(VdbeSorter *pSorter,int rcin)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int rc2;
  SortSubtask *pTask;
  int i;
  int rc;
  undefined4 local_14;
  undefined4 local_10;
  
  local_14 = (uint)*(byte *)(in_RDI + 0x5b);
  local_10 = in_ESI;
  while (local_14 = local_14 - 1, -1 < (int)local_14) {
    iVar1 = vdbeSorterJoinThread((SortSubtask *)(in_RDI + 0x60 + (long)(int)local_14 * 0x60));
    if (local_10 == 0) {
      local_10 = iVar1;
    }
  }
  return local_10;
}

Assistant:

static int vdbeSorterJoinAll(VdbeSorter *pSorter, int rcin){
  int rc = rcin;
  int i;

  /* This function is always called by the main user thread.
  **
  ** If this function is being called after SorterRewind() has been called,
  ** it is possible that thread pSorter->aTask[pSorter->nTask-1].pThread
  ** is currently attempt to join one of the other threads. To avoid a race
  ** condition where this thread also attempts to join the same object, join
  ** thread pSorter->aTask[pSorter->nTask-1].pThread first. */
  for(i=pSorter->nTask-1; i>=0; i--){
    SortSubtask *pTask = &pSorter->aTask[i];
    int rc2 = vdbeSorterJoinThread(pTask);
    if( rc==SQLITE_OK ) rc = rc2;
  }
  return rc;
}